

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O0

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::factorize(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this)

{
  SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  type_conflict5 tVar2;
  uint uVar3;
  int iVar4;
  SPxStatus SVar5;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  **ppSVar6;
  undefined8 uVar7;
  string *m;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffb88;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffb90;
  allocator *this_00;
  undefined4 in_stack_fffffffffffffb98;
  SPxStatus in_stack_fffffffffffffb9c;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffba0;
  int local_454;
  allocator local_409;
  string local_408 [32];
  int local_3e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3e4;
  undefined1 local_394 [80];
  int local_344;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_340;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2f0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a0;
  undefined1 local_250 [83];
  undefined1 local_1fd;
  allocator local_1e9;
  string local_1e8 [32];
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined1 local_198 [88];
  undefined8 local_140;
  int *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  undefined8 local_128;
  int *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  undefined8 local_110;
  int *local_108;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  undefined1 *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  undefined1 *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  int *local_d8;
  int *local_d0;
  int *local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  undefined1 *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined1 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8;
  
  if ((in_RDI->matrixIsSetup & 1U) == 0) {
    (*in_RDI->_vptr_SPxBasisBase[5])(in_RDI,&in_RDI->thedesc);
  }
  in_RDI->updateCount = 0;
  pSVar1 = in_RDI->factor;
  ppSVar6 = DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
            ::get_ptr(&in_RDI->matrix);
  uVar3 = DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
          ::size(&in_RDI->matrix);
  iVar4 = (*pSVar1->_vptr_SLinSolver[5])(pSVar1,ppSVar6,(ulong)uVar3);
  if (iVar4 == 0) {
    SVar5 = status(in_RDI);
    if (SVar5 == SINGULAR) {
      setStatus(in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c);
    }
    in_RDI->factorized = true;
    (*in_RDI->factor->_vptr_SLinSolver[6])(local_198);
    local_e0 = &in_RDI->minStab;
    local_e8 = local_198;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
    local_1a0 = 0x3f1a36e2eb1c432d;
    tVar2 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffffb88,(double *)0x4fad67);
    if (tVar2) {
      local_1a8 = 0x3f50624dd2f1a9fc;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
      ::operator*=((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                   (double *)in_stack_fffffffffffffb90);
    }
    local_1b0 = 0x3ee4f8b588e368f1;
    tVar2 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffffb88,(double *)0x4fadc1);
    if (tVar2) {
      local_1b8 = 0x3f847ae147ae147b;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
      ::operator*=((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                   (double *)in_stack_fffffffffffffb90);
    }
    local_1c0 = 0x3eb0c6f7a0b5ed8d;
    tVar2 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffffb88,(double *)0x4fae1b);
    if (tVar2) {
      local_1c8 = 0x3fb999999999999a;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
      ::operator*=((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                   (double *)in_stack_fffffffffffffb90);
    }
  }
  else {
    if (iVar4 != 2) {
      std::operator<<((ostream *)&std::cerr,"EBASIS08 error: unknown status of factorization.\n");
      in_RDI->factorized = false;
      local_1fd = 1;
      uVar7 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e8,"XBASIS01 This should never happen.",&local_1e9);
      SPxInternalCodeException::SPxInternalCodeException
                ((SPxInternalCodeException *)in_stack_fffffffffffffb90,
                 (string *)in_stack_fffffffffffffb88);
      local_1fd = 0;
      __cxa_throw(uVar7,&SPxInternalCodeException::typeinfo,
                  SPxInternalCodeException::~SPxInternalCodeException);
    }
    setStatus(in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c);
    in_RDI->factorized = false;
  }
  iVar4 = (*in_RDI->factor->_vptr_SLinSolver[3])();
  in_RDI->lastMem = iVar4;
  local_138 = &in_RDI->lastMem;
  local_130 = &local_2f0;
  local_140 = 0;
  local_c8 = local_138;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffba0,
             CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),in_stack_fffffffffffffb90
            );
  local_28 = &local_2a0;
  local_38 = &local_2f0;
  local_30 = &in_RDI->fillFactor;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_39,&in_RDI->fillFactor,local_38);
  local_20 = &local_2a0;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffffb90);
  local_8 = &local_2a0;
  local_10 = local_30;
  local_18 = local_38;
  boost::multiprecision::default_ops::
  eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
             (cpp_dec_float<100U,_int,_void> *)0x4fb09a);
  if (in_RDI->nzCount < 1) {
    local_454 = 1;
  }
  else {
    local_454 = in_RDI->nzCount;
  }
  local_344 = local_454;
  local_118 = &local_340;
  local_120 = &local_344;
  local_128 = 0;
  local_d0 = local_120;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffba0,
             CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),in_stack_fffffffffffffb90
            );
  local_a8 = local_250;
  local_b0 = &local_2a0;
  local_b8 = &local_340;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_b9,local_b0,local_b8);
  local_a0 = local_250;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffffb90);
  local_88 = local_250;
  local_90 = local_b0;
  local_98 = local_b8;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
             (cpp_dec_float<100U,_int,_void> *)0x4fb1de);
  local_f0 = &in_RDI->lastFill;
  local_f8 = local_250;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  local_70 = &in_RDI->nonzeroFactor;
  if (in_RDI->nzCount < 1) {
    local_3e8 = 1;
  }
  else {
    local_3e8 = in_RDI->nzCount;
  }
  local_100 = &local_3e4;
  local_108 = &local_3e8;
  local_110 = 0;
  local_d8 = local_108;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_70->m_backend,CONCAT44(local_3e8,in_stack_fffffffffffffb98),
             in_stack_fffffffffffffb90);
  local_68 = local_394;
  local_78 = &local_3e4;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_79,local_70,local_78);
  local_60 = local_394;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffffb90);
  local_48 = local_394;
  local_50 = local_70;
  local_58 = local_78;
  boost::multiprecision::default_ops::
  eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
             (cpp_dec_float<100U,_int,_void> *)0x4fb363);
  iVar4 = boost::multiprecision::number::operator_cast_to_int
                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)0x4fb370);
  in_RDI->lastNzCount = iVar4;
  SVar5 = status(in_RDI);
  if (SVar5 != SINGULAR) {
    return;
  }
  m = (string *)__cxa_allocate_exception(0x28);
  this_00 = &local_409;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_408,"Cannot factorize singular matrix",this_00);
  SPxStatusException::SPxStatusException((SPxStatusException *)this_00,m);
  __cxa_throw(m,&SPxStatusException::typeinfo,SPxStatusException::~SPxStatusException);
}

Assistant:

void SPxBasisBase<R>::factorize()
{

   assert(factor != nullptr);

   if(!matrixIsSetup)
      loadDesc(thedesc);

   assert(matrixIsSetup);

   updateCount = 0;

   switch(factor->load(matrix.get_ptr(), matrix.size()))
   {
   case SLinSolver<R>::OK :
      if(status() == SINGULAR)
         setStatus(REGULAR);

      factorized = true;
      minStab = factor->stability();

      // This seems always to be about 1e-7
      if(minStab > 1e-4)
         minStab *= 0.001;

      if(minStab > 1e-5)
         minStab *= 0.01;

      if(minStab > 1e-6)
         minStab *= 0.1;

      break;

   case SLinSolver<R>::SINGULAR :
      setStatus(SINGULAR);
      factorized = false;
      break;

   default :
      SPX_MSG_ERROR(std::cerr << "EBASIS08 error: unknown status of factorization.\n";)
      factorized = false;
      throw SPxInternalCodeException("XBASIS01 This should never happen.");
   }

   // get nonzero count of factorization
   lastMem    = factor->memory();
   // compute fill ratio between factorization and basis matrix (multiplied with tolerance)
   lastFill   = fillFactor * R(lastMem) / R(nzCount > 0 ? nzCount : 1);
   lastNzCount = int(nonzeroFactor * R(nzCount > 0 ? nzCount : 1));

   if(status() == SINGULAR)
   {
      throw SPxStatusException("Cannot factorize singular matrix");
   }
}